

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifParseOutputs(Io_BlifMan_t *p,char *pLine)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Io_BlifObj_t *Entry;
  int local_2c;
  int i;
  char *pToken;
  Io_BlifObj_t *pObj;
  char *pLine_local;
  Io_BlifMan_t *p_local;
  
  Io_BlifSplitIntoTokens(p->vTokens,pLine,'\0');
  pcVar3 = (char *)Vec_PtrEntry(p->vTokens,0);
  iVar1 = strcmp(pcVar3,"outputs");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(pToken, \"outputs\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                  ,0x2a5,"int Io_BlifParseOutputs(Io_BlifMan_t *, char *)");
  }
  for (local_2c = 1; iVar1 = Vec_PtrSize(p->vTokens), local_2c < iVar1; local_2c = local_2c + 1) {
    pcVar3 = (char *)Vec_PtrEntry(p->vTokens,local_2c);
    Entry = Io_BlifHashFindOrAdd(p,pcVar3);
    __stream = _stdout;
    if ((*(uint *)Entry >> 1 & 1) != 0) {
      uVar2 = Io_BlifGetLine(p,pcVar3);
      fprintf(__stream,"Line %d: Primary output (%s) is defined more than once (warning only).\n",
              (ulong)uVar2,pcVar3);
    }
    *(uint *)Entry = *(uint *)Entry & 0xfffffffd | 2;
    Vec_PtrPush(p->vPos,Entry);
  }
  return 1;
}

Assistant:

static int Io_BlifParseOutputs( Io_BlifMan_t * p, char * pLine )
{
    Io_BlifObj_t * pObj;
    char * pToken;
    int i;
    Io_BlifSplitIntoTokens( p->vTokens, pLine, '\0' );
    pToken = (char *)Vec_PtrEntry(p->vTokens, 0);
    assert( !strcmp(pToken, "outputs") );
    Vec_PtrForEachEntryStart( char *, p->vTokens, pToken, i, 1 )
    {
        pObj = Io_BlifHashFindOrAdd( p, pToken );
        if ( pObj->fPo )
            fprintf( stdout, "Line %d: Primary output (%s) is defined more than once (warning only).\n", Io_BlifGetLine(p, pToken), pToken );
        pObj->fPo = 1;
        Vec_PtrPush( p->vPos, pObj );
    }
    return 1;
}